

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  uint32_t size;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  char *pcVar1;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  LogFinisher local_69;
  char *local_68;
  LogMessage local_60;
  
  local_68 = ptr;
  if (arena == (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x10c);
    other = LogMessage::operator<<(&local_60,"CHECK failed: arena != nullptr: ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_60);
  }
  size = ReadSize(&local_68);
  if (local_68 != (char *)0x0) {
    s_00 = Arena::Create<std::__cxx11::string>(arena);
    pcVar1 = ReadString(this,local_68,size,s_00);
    if (pcVar1 != (char *)0x0) {
      (s->tagged_ptr_).ptr_ = s_00;
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  GOOGLE_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = Arena::Create<std::string>(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);

  SetStrWithHeapBuffer(str, s);

  return ptr;
}